

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void filterScanline(uchar *out,uchar *scanline,uchar *prevline,size_t length,size_t bytewidth,
                   uchar filterType)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined7 in_register_00000089;
  byte bVar8;
  uint uVar9;
  
  switch(CONCAT71(in_register_00000089,filterType) & 0xffffffff) {
  case 0:
    if (length != 0) {
      sVar3 = 0;
      do {
        out[sVar3] = scanline[sVar3];
        sVar3 = sVar3 + 1;
      } while (length != sVar3);
    }
    break;
  case 1:
    if (bytewidth != 0) {
      sVar3 = 0;
      do {
        out[sVar3] = scanline[sVar3];
        sVar3 = sVar3 + 1;
      } while (bytewidth != sVar3);
    }
    if (bytewidth < length) {
      lVar4 = 0;
      do {
        out[lVar4 + bytewidth] = scanline[lVar4 + bytewidth] - scanline[lVar4];
        lVar4 = lVar4 + 1;
      } while (length - bytewidth != lVar4);
    }
    break;
  case 2:
    if (prevline == (uchar *)0x0) {
      if (length != 0) {
        sVar3 = 0;
        do {
          out[sVar3] = scanline[sVar3];
          sVar3 = sVar3 + 1;
        } while (length != sVar3);
      }
    }
    else if (length != 0) {
      sVar3 = 0;
      do {
        out[sVar3] = scanline[sVar3] - prevline[sVar3];
        sVar3 = sVar3 + 1;
      } while (length != sVar3);
    }
    break;
  case 3:
    if (prevline == (uchar *)0x0) {
      if (bytewidth != 0) {
        sVar3 = 0;
        do {
          out[sVar3] = scanline[sVar3];
          sVar3 = sVar3 + 1;
        } while (bytewidth != sVar3);
      }
      if (bytewidth < length) {
        lVar4 = 0;
        do {
          out[lVar4 + bytewidth] = scanline[lVar4 + bytewidth] - (scanline[lVar4] >> 1);
          lVar4 = lVar4 + 1;
        } while (length - bytewidth != lVar4);
      }
    }
    else {
      if (bytewidth != 0) {
        sVar3 = 0;
        do {
          out[sVar3] = scanline[sVar3] - (prevline[sVar3] >> 1);
          sVar3 = sVar3 + 1;
        } while (bytewidth != sVar3);
      }
      if (bytewidth < length) {
        lVar4 = 0;
        do {
          out[lVar4 + bytewidth] =
               scanline[lVar4 + bytewidth] -
               (char)((uint)prevline[lVar4 + bytewidth] + (uint)scanline[lVar4] >> 1);
          lVar4 = lVar4 + 1;
        } while (length - bytewidth != lVar4);
      }
    }
    break;
  case 4:
    if (prevline == (uchar *)0x0) {
      if (bytewidth != 0) {
        sVar3 = 0;
        do {
          out[sVar3] = scanline[sVar3];
          sVar3 = sVar3 + 1;
        } while (bytewidth != sVar3);
      }
      if (bytewidth < length) {
        lVar4 = 0;
        do {
          out[lVar4 + bytewidth] = scanline[lVar4 + bytewidth] - scanline[lVar4];
          lVar4 = lVar4 + 1;
        } while (length - bytewidth != lVar4);
      }
    }
    else {
      if (bytewidth != 0) {
        sVar3 = 0;
        do {
          out[sVar3] = scanline[sVar3] - prevline[sVar3];
          sVar3 = sVar3 + 1;
        } while (bytewidth != sVar3);
      }
      if (bytewidth < length) {
        lVar4 = 0;
        do {
          bVar8 = scanline[lVar4];
          bVar1 = prevline[bytewidth];
          bVar2 = prevline[lVar4];
          uVar5 = (uint)bVar1 - (uint)bVar2;
          uVar9 = -uVar5;
          if (0 < (int)uVar5) {
            uVar9 = uVar5;
          }
          uVar9 = uVar9 & 0xff;
          uVar6 = (uint)bVar8 - (uint)bVar2;
          uVar5 = -uVar6;
          if (0 < (int)uVar6) {
            uVar5 = uVar6;
          }
          uVar7 = (uint)bVar1 + (uint)bVar8 + (uint)bVar2 * -2;
          uVar6 = -uVar7;
          if (0 < (int)uVar7) {
            uVar6 = uVar7;
          }
          if ((uVar5 & 0xff) < uVar9) {
            bVar8 = bVar1;
            uVar9 = uVar5 & 0xff;
          }
          if (uVar6 < uVar9) {
            bVar8 = bVar2;
          }
          out[bytewidth] = scanline[bytewidth] - bVar8;
          bytewidth = bytewidth + 1;
          lVar4 = lVar4 + 1;
        } while (length != bytewidth);
        return;
      }
    }
  }
  return;
}

Assistant:

static void filterScanline(unsigned char* out, const unsigned char* scanline, const unsigned char* prevline,
  size_t length, size_t bytewidth, unsigned char filterType) {
  size_t i;
  switch (filterType) {
  case 0: /*None*/
    for (i = 0; i != length; ++i) out[i] = scanline[i];
    break;
  case 1: /*Sub*/
    for (i = 0; i != bytewidth; ++i) out[i] = scanline[i];
    for (i = bytewidth; i < length; ++i) out[i] = scanline[i] - scanline[i - bytewidth];
    break;
  case 2: /*Up*/
    if (prevline) {
      for (i = 0; i != length; ++i) out[i] = scanline[i] - prevline[i];
    }
    else {
      for (i = 0; i != length; ++i) out[i] = scanline[i];
    }
    break;
  case 3: /*Average*/
    if (prevline) {
      for (i = 0; i != bytewidth; ++i) out[i] = scanline[i] - (prevline[i] >> 1);
      for (i = bytewidth; i < length; ++i) out[i] = scanline[i] - ((scanline[i - bytewidth] + prevline[i]) >> 1);
    }
    else {
      for (i = 0; i != bytewidth; ++i) out[i] = scanline[i];
      for (i = bytewidth; i < length; ++i) out[i] = scanline[i] - (scanline[i - bytewidth] >> 1);
    }
    break;
  case 4: /*Paeth*/
    if (prevline) {
      /*paethPredictor(0, prevline[i], 0) is always prevline[i]*/
      for (i = 0; i != bytewidth; ++i) out[i] = (scanline[i] - prevline[i]);
      for (i = bytewidth; i < length; ++i) {
        out[i] = (scanline[i] - paethPredictor(scanline[i - bytewidth], prevline[i], prevline[i - bytewidth]));
      }
    }
    else {
      for (i = 0; i != bytewidth; ++i) out[i] = scanline[i];
      /*paethPredictor(scanline[i - bytewidth], 0, 0) is always scanline[i - bytewidth]*/
      for (i = bytewidth; i < length; ++i) out[i] = (scanline[i] - scanline[i - bytewidth]);
    }
    break;
  default: return; /*invalid filter type given*/
  }
}